

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O2

void __thiscall slang::ast::EvalContext::addDiags(EvalContext *this,Diagnostics *additional)

{
  bool bVar1;
  long lVar2;
  pointer args;
  Diagnostic copy;
  Diagnostic DStack_98;
  
  args = (additional->super_SmallVector<slang::Diagnostic,_2UL>).
         super_SmallVectorBase<slang::Diagnostic>.data_;
  bVar1 = true;
  for (lVar2 = (additional->super_SmallVector<slang::Diagnostic,_2UL>).
               super_SmallVectorBase<slang::Diagnostic>.len * 0x70; lVar2 != 0;
      lVar2 = lVar2 + -0x70) {
    if (bVar1) {
      Diagnostic::Diagnostic(&DStack_98,args);
      reportStack(this,&DStack_98);
      SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                ((SmallVectorBase<slang::Diagnostic> *)&this->diags,&DStack_98);
      Diagnostic::~Diagnostic(&DStack_98);
    }
    else {
      SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic_const&>
                ((SmallVectorBase<slang::Diagnostic> *)&this->diags,args);
    }
    args = args + 1;
    bVar1 = false;
  }
  return;
}

Assistant:

void EvalContext::addDiags(const Diagnostics& additional) {
    bool first = true;
    for (auto& diag : additional) {
        if (first) {
            Diagnostic copy = diag;
            reportStack(copy);
            diags.emplace_back(std::move(copy));
            first = false;
        }
        else {
            diags.push_back(diag);
        }
    }
}